

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  bool *pbVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  ImRect local_28;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    __assert_fail("window == g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2749,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
  }
  if (((uint)window->Flags >> 0x12 & 1) == 0) {
    if (((((uint)window->Flags >> 0x1a & 1) != 0) || (window->RootWindow == window)) ||
       (window->NavLastIds[0] == 0 || force_reinit)) {
      bVar4 = 1;
    }
    else {
      bVar4 = 0;
    }
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)bVar4,window->Name,(ulong)GImGui->NavLayer);
    }
    if (bVar4 == 0) {
      pIVar2->NavId = window->NavLastIds[0];
      pIVar2->NavFocusScopeId = 0;
    }
    else {
      local_28.Min.x = 0.0;
      local_28.Min.y = 0.0;
      local_28.Max.x = 0.0;
      local_28.Max.y = 0.0;
      SetNavID(0,pIVar2->NavLayer,0,&local_28);
      pIVar2->NavInitRequest = true;
      pIVar2->NavInitRequestFromMove = false;
      pIVar2->NavInitResultId = 0;
      (pIVar2->NavInitResultRectRel).Min.x = 0.0;
      (pIVar2->NavInitResultRectRel).Min.y = 0.0;
      (pIVar2->NavInitResultRectRel).Max.x = 0.0;
      pIVar3 = GImGui;
      (pIVar2->NavInitResultRectRel).Max.y = 0.0;
      if (GImGui->NavMoveScoringItems == false) {
        pbVar1 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar1;
        if (*pbVar1 == false) {
          return;
        }
      }
      else {
        GImGui->NavAnyRequest = true;
      }
      if (pIVar3->NavWindow == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2742,"void ImGui::NavUpdateAnyRequestFlag()");
      }
    }
  }
  else {
    pIVar2->NavId = 0;
    pIVar2->NavFocusScopeId = 0;
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = g.NavFocusScopeId = 0;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}